

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O1

void __thiscall
de::details::UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>::
reset(UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_> *this)

{
  DescriptorPoolBuilder *pDVar1;
  void *pvVar2;
  
  pDVar1 = (this->m_data).ptr;
  if (pDVar1 != (DescriptorPoolBuilder *)0x0) {
    pvVar2 = (pDVar1->m_counts).
             super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)(pDVar1->m_counts).
                                   super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2
                     );
    }
    operator_delete(pDVar1,0x18);
    (this->m_data).ptr = (DescriptorPoolBuilder *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}